

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::optional<dap::Message>_>::destruct
          (BasicTypeInfo<dap::optional<dap::Message>_> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::optional<dap::Message>_> *this_local;
  
  optional<dap::Message>::~optional((optional<dap::Message> *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }